

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearObjectStatePdu.cpp
# Opt level: O0

int __thiscall DIS::LinearObjectStatePdu::getMarshalledSize(LinearObjectStatePdu *this)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  size_type sVar8;
  const_reference pvVar9;
  undefined1 local_88 [8];
  LinearSegmentParameter listElement;
  unsigned_long_long idx;
  int marshalSize;
  LinearObjectStatePdu *this_local;
  
  iVar2 = SyntheticEnvironmentFamilyPdu::getMarshalledSize
                    (&this->super_SyntheticEnvironmentFamilyPdu);
  iVar3 = EntityID::getMarshalledSize(&this->_objectID);
  iVar4 = EntityID::getMarshalledSize(&this->_referencedObjectID);
  iVar5 = SimulationAddress::getMarshalledSize(&this->_requesterID);
  iVar6 = SimulationAddress::getMarshalledSize(&this->_receivingID);
  iVar7 = ObjectType::getMarshalledSize(&this->_objectType);
  idx._4_4_ = iVar2 + iVar3 + iVar4 + 4 + iVar5 + iVar6 + iVar7;
  listElement._pad1 = 0;
  listElement._100_4_ = 0;
  while( true ) {
    uVar1 = listElement._96_8_;
    sVar8 = std::vector<DIS::LinearSegmentParameter,_std::allocator<DIS::LinearSegmentParameter>_>::
            size(&this->_linearSegmentParameters);
    if (sVar8 <= (ulong)uVar1) break;
    pvVar9 = std::vector<DIS::LinearSegmentParameter,_std::allocator<DIS::LinearSegmentParameter>_>
             ::operator[](&this->_linearSegmentParameters,listElement._96_8_);
    LinearSegmentParameter::LinearSegmentParameter((LinearSegmentParameter *)local_88,pvVar9);
    iVar2 = LinearSegmentParameter::getMarshalledSize((LinearSegmentParameter *)local_88);
    idx._4_4_ = idx._4_4_ + iVar2;
    LinearSegmentParameter::~LinearSegmentParameter((LinearSegmentParameter *)local_88);
    listElement._96_8_ = listElement._96_8_ + 1;
  }
  return idx._4_4_;
}

Assistant:

int LinearObjectStatePdu::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = SyntheticEnvironmentFamilyPdu::getMarshalledSize();
   marshalSize = marshalSize + _objectID.getMarshalledSize();  // _objectID
   marshalSize = marshalSize + _referencedObjectID.getMarshalledSize();  // _referencedObjectID
   marshalSize = marshalSize + 2;  // _updateNumber
   marshalSize = marshalSize + 1;  // _forceID
   marshalSize = marshalSize + 1;  // _numberOfSegments
   marshalSize = marshalSize + _requesterID.getMarshalledSize();  // _requesterID
   marshalSize = marshalSize + _receivingID.getMarshalledSize();  // _receivingID
   marshalSize = marshalSize + _objectType.getMarshalledSize();  // _objectType

   for(unsigned long long idx=0; idx < _linearSegmentParameters.size(); idx++)
   {
        LinearSegmentParameter listElement = _linearSegmentParameters[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}